

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorShader.cpp
# Opt level: O0

void __thiscall Rml::DecoratorShader::~DecoratorShader(DecoratorShader *this)

{
  DecoratorShader *this_local;
  
  (this->super_Decorator)._vptr_Decorator = (_func_int **)&PTR__DecoratorShader_00815df8;
  ::std::__cxx11::string::~string((string *)&this->value);
  Decorator::~Decorator(&this->super_Decorator);
  return;
}

Assistant:

DecoratorShader::~DecoratorShader() {}